

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O2

void sysbvm_functionBytecodeDirectCompiler_registerPrimitives(void)

{
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astNode_primitiveCompileIntoBytecode,"ASTNode::doCompileIntoBytecodeWith:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astBreakNode_primitiveCompileIntoBytecode,
             "ASTBreakNode::doCompileIntoBytecodeWith:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astCoerceValueNode_primitiveCompileIntoBytecode,
             "ASTCoerceValueNode::doCompileIntoBytecodeWith:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astContinueNode_primitiveCompileIntoBytecode,
             "ASTContinueNode::doCompileIntoBytecodeWith:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astDoWhileContinueWithNode_primitiveCompileIntoBytecode,
             "ASTDoWhileContinueWithNode::doCompileIntoBytecodeWith:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astDownCastNode_primitiveCompileIntoBytecode,
             "ASTDownCastNode::doCompileIntoBytecodeWith:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astFunctionApplicationNode_primitiveCompileIntoBytecode,
             "ASTFunctionApplicationNode::doCompileIntoBytecodeWith:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astIdentifierReferenceNode_primitiveCompileIntoBytecode,
             "ASTIdentifierReferenceNode::doCompileIntoBytecodeWith:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astIfNode_primitiveCompileIntoBytecode,"ASTIfNode::doCompileIntoBytecodeWith:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astLambdaNode_primitiveCompileIntoBytecode,
             "ASTLambdaNode::doCompileIntoBytecodeWith:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astLexicalBlockNode_primitiveCompileIntoBytecode,
             "ASTLexicalBlockNode::doCompileIntoBytecodeWith:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astLiteralNode_primitiveCompileIntoBytecode,
             "ASTLiteralNode::doCompileIntoBytecodeWith:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astVariableDefinitionNode_primitiveCompileIntoBytecode,
             "ASTVariableDefinitionNode::doCompileIntoBytecodeWith:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astMakeArrayNode_primitiveCompileIntoBytecode,
             "ASTMakeArrayNode::doCompileIntoBytecodeWith:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astMakeAssociationNode_primitiveCompileIntoBytecode,
             "ASTMakeAssociationNode::doCompileIntoBytecodeWith:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astMakeByteArrayNode_primitiveCompileIntoBytecode,
             "ASTMakeByteArrayNode::doCompileIntoBytecodeWith:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astMakeDictionaryNode_primitiveCompileIntoBytecode,
             "ASTMakeDictionaryNode::doCompileIntoBytecodeWith:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astMessageSendNode_primitiveCompileIntoBytecode,
             "ASTMessageSendNode::doCompileIntoBytecodeWith:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astReturnNode_primitiveCompileIntoBytecode,
             "ASTReturnNode::doCompileIntoBytecodeWith:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astSequenceNode_primitiveCompileIntoBytecode,
             "ASTSequenceNode::doCompileIntoBytecodeWith:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astSwitchNode_primitiveCompileIntoBytecode,
             "ASTSwitchNode::doCompileIntoBytecodeWith:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astTupleSlotNamedAtNode_primitiveCompileIntoBytecode,
             "ASTTupleSlotNamedAtNode::doCompileIntoBytecodeWith:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astTupleSlotNamedAtPutNode_primitiveCompileIntoBytecode,
             "ASTTupleSlotNamedAtPutNode::doCompileIntoBytecodeWith:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astTupleSlotNamedReferenceAtNode_primitiveCompileIntoBytecode,
             "ASTTupleSlotNamedReferenceAtNode::doCompileIntoBytecodeWith:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astUseNamedSlotsOfNode_primitiveCompileIntoBytecode,
             "ASTUseNamedSlotsOfNode::doCompileIntoBytecodeWith:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_astWhileContinueNode_primitiveCompileIntoBytecode,
             "ASTWhileNodeNode::doCompileIntoBytecodeWith:");
  return;
}

Assistant:

void sysbvm_functionBytecodeDirectCompiler_registerPrimitives(void)
{
    sysbvm_primitiveTable_registerFunction(sysbvm_astNode_primitiveCompileIntoBytecode, "ASTNode::doCompileIntoBytecodeWith:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astBreakNode_primitiveCompileIntoBytecode, "ASTBreakNode::doCompileIntoBytecodeWith:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astCoerceValueNode_primitiveCompileIntoBytecode, "ASTCoerceValueNode::doCompileIntoBytecodeWith:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astContinueNode_primitiveCompileIntoBytecode, "ASTContinueNode::doCompileIntoBytecodeWith:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astDoWhileContinueWithNode_primitiveCompileIntoBytecode, "ASTDoWhileContinueWithNode::doCompileIntoBytecodeWith:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astDownCastNode_primitiveCompileIntoBytecode, "ASTDownCastNode::doCompileIntoBytecodeWith:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astFunctionApplicationNode_primitiveCompileIntoBytecode, "ASTFunctionApplicationNode::doCompileIntoBytecodeWith:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astIdentifierReferenceNode_primitiveCompileIntoBytecode, "ASTIdentifierReferenceNode::doCompileIntoBytecodeWith:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astIfNode_primitiveCompileIntoBytecode, "ASTIfNode::doCompileIntoBytecodeWith:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astLambdaNode_primitiveCompileIntoBytecode, "ASTLambdaNode::doCompileIntoBytecodeWith:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astLexicalBlockNode_primitiveCompileIntoBytecode, "ASTLexicalBlockNode::doCompileIntoBytecodeWith:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astLiteralNode_primitiveCompileIntoBytecode, "ASTLiteralNode::doCompileIntoBytecodeWith:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astVariableDefinitionNode_primitiveCompileIntoBytecode, "ASTVariableDefinitionNode::doCompileIntoBytecodeWith:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astMakeArrayNode_primitiveCompileIntoBytecode, "ASTMakeArrayNode::doCompileIntoBytecodeWith:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astMakeAssociationNode_primitiveCompileIntoBytecode, "ASTMakeAssociationNode::doCompileIntoBytecodeWith:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astMakeByteArrayNode_primitiveCompileIntoBytecode, "ASTMakeByteArrayNode::doCompileIntoBytecodeWith:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astMakeDictionaryNode_primitiveCompileIntoBytecode, "ASTMakeDictionaryNode::doCompileIntoBytecodeWith:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astMessageSendNode_primitiveCompileIntoBytecode, "ASTMessageSendNode::doCompileIntoBytecodeWith:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astReturnNode_primitiveCompileIntoBytecode, "ASTReturnNode::doCompileIntoBytecodeWith:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astSequenceNode_primitiveCompileIntoBytecode, "ASTSequenceNode::doCompileIntoBytecodeWith:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astSwitchNode_primitiveCompileIntoBytecode, "ASTSwitchNode::doCompileIntoBytecodeWith:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astTupleSlotNamedAtNode_primitiveCompileIntoBytecode, "ASTTupleSlotNamedAtNode::doCompileIntoBytecodeWith:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astTupleSlotNamedAtPutNode_primitiveCompileIntoBytecode, "ASTTupleSlotNamedAtPutNode::doCompileIntoBytecodeWith:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astTupleSlotNamedReferenceAtNode_primitiveCompileIntoBytecode, "ASTTupleSlotNamedReferenceAtNode::doCompileIntoBytecodeWith:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astUseNamedSlotsOfNode_primitiveCompileIntoBytecode, "ASTUseNamedSlotsOfNode::doCompileIntoBytecodeWith:");
    sysbvm_primitiveTable_registerFunction(sysbvm_astWhileContinueNode_primitiveCompileIntoBytecode, "ASTWhileNodeNode::doCompileIntoBytecodeWith:");
}